

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
          (basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  semantic_tag sVar1;
  bool bVar2;
  json_const_reference_storage jVar3;
  half_storage hVar4;
  int64_t iVar5;
  undefined8 uVar6;
  int64_t iVar7;
  byte bVar8;
  common_storage cVar9;
  ulong uVar10;
  undefined4 auStack_cc [3];
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbStack_c0;
  undefined4 auStack_8c [5];
  basic_json<wchar_t,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbStack_78;
  undefined4 auStack_44 [5];
  bool_storage temp;
  
  bVar8 = (byte)(other->field_0).json_const_pointer_ & 0xf;
  switch(bVar8) {
  case 0:
  case 4:
    cVar9 = (other->field_0).common_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    goto LAB_00669587;
  case 1:
    bVar2 = (other->field_0).boolean_.val_;
    cVar9 = (other->field_0).common_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    (this->field_0).boolean_.val_ = bVar2;
LAB_00669587:
    (this->field_0).common_ = cVar9;
    return;
  default:
    uVar6 = *(undefined8 *)&other->field_0;
    iVar5 = (other->field_0).int64_.val_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    *(undefined8 *)&this->field_0 = uVar6;
    (this->field_0).int64_.val_ = iVar5;
    return;
  case 6:
    hVar4 = (other->field_0).half_float_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    (this->field_0).half_float_ = hVar4;
    return;
  case 7:
    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
              ();
    return;
  case 10:
  case 0xb:
    break;
  case 0xc:
  case 0xd:
  case 0xe:
    sVar1 = (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    *(byte *)&this->field_0 = bVar8;
    (this->field_0).common_.tag_ = sVar1;
    (this->field_0).int64_.val_ = iVar5;
    return;
  case 0xf:
    sVar1 = (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    (other->field_0).json_const_pointer_ =
         (json_const_reference_storage)((byte)(this->field_0).json_const_pointer_ & 0xf);
    (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
    (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
    (this->field_0).common_.tag_ = sVar1;
    (this->field_0).int64_.val_ = iVar5;
    return;
  }
  bVar8 = *(byte *)&other->field_0;
  switch(bVar8 & 0xf) {
  case 0:
  case 4:
    cVar9 = (other->field_0).common_;
    iVar5 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar5;
    goto LAB_006696ba;
  case 1:
    bVar2 = (other->field_0).boolean_.val_;
    cVar9 = (other->field_0).common_;
    iVar5 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar5;
    (this->field_0).boolean_.val_ = bVar2;
LAB_006696ba:
    (this->field_0).common_ = cVar9;
    break;
  default:
    uVar6 = *(undefined8 *)&other->field_0;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar7;
    *(undefined8 *)&this->field_0 = uVar6;
    (this->field_0).int64_.val_ = iVar5;
    break;
  case 6:
    hVar4 = (other->field_0).half_float_;
    iVar5 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar5;
    (this->field_0).half_float_ = hVar4;
    break;
  case 7:
    sVar1 = (other->field_0).common_.tag_;
    uVar10 = (ulong)(bVar8 >> 2 & 0xfffffffc);
    memcpy(auStack_44,(void *)((long)&other->field_0 + 4),uVar10);
    auStack_44[bVar8 >> 4] = 0;
    iVar5 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar5;
    *(byte *)&this->field_0 = bVar8;
    (this->field_0).common_.tag_ = sVar1;
    memcpy((void *)((long)&this->field_0 + 4),auStack_44,uVar10);
    *(undefined4 *)((long)&this->field_0 + (ulong)(bVar8 >> 4) * 4 + 4) = 0;
    break;
  case 10:
  case 0xb:
    bVar8 = *(byte *)&other->field_0;
    pbStack_78 = this;
    switch(bVar8 & 0xf) {
    case 0:
    case 4:
      cVar9 = (other->field_0).common_;
      iVar5 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar5;
      goto LAB_006697ee;
    case 1:
      bVar2 = (other->field_0).boolean_.val_;
      cVar9 = (other->field_0).common_;
      iVar5 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar5;
      (this->field_0).boolean_.val_ = bVar2;
LAB_006697ee:
      (this->field_0).common_ = cVar9;
      break;
    default:
      uVar6 = *(undefined8 *)&other->field_0;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar7;
      *(undefined8 *)&this->field_0 = uVar6;
      (this->field_0).int64_.val_ = iVar5;
      break;
    case 6:
      hVar4 = (other->field_0).half_float_;
      iVar5 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar5;
      (this->field_0).half_float_ = hVar4;
      break;
    case 7:
      sVar1 = (other->field_0).common_.tag_;
      uVar10 = (ulong)(bVar8 >> 2 & 0xfffffffc);
      memcpy(auStack_8c,(void *)((long)&other->field_0 + 4),uVar10);
      auStack_8c[bVar8 >> 4] = 0;
      iVar5 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar5;
      *(byte *)&this->field_0 = bVar8;
      (this->field_0).common_.tag_ = sVar1;
      memcpy((void *)((long)&this->field_0 + 4),auStack_8c,uVar10);
      *(undefined4 *)((long)&this->field_0 + (ulong)(bVar8 >> 4) * 4 + 4) = 0;
      break;
    case 10:
    case 0xb:
      jVar3 = (other->field_0).json_const_pointer_;
      sVar1 = (other->field_0).common_.tag_;
      uVar10 = (ulong)((byte)jVar3 >> 4);
      pbStack_c0 = this;
      memcpy(auStack_cc,(void *)((long)&other->field_0 + 4),uVar10 * 4);
      auStack_cc[uVar10] = 0;
      (other->field_0).common_ = (this->field_0).common_;
      (this->field_0).json_const_pointer_ = jVar3;
      (this->field_0).common_.tag_ = sVar1;
      memcpy((void *)((long)&this->field_0 + 4),auStack_cc,uVar10 * 4);
      *(undefined4 *)((long)&this->field_0 + uVar10 * 4 + 4) = 0;
      return;
    case 0xc:
    case 0xd:
    case 0xe:
      sVar1 = (other->field_0).common_.tag_;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar7;
      *(byte *)&this->field_0 = bVar8 & 0xf;
      (this->field_0).common_.tag_ = sVar1;
      (this->field_0).int64_.val_ = iVar5;
      break;
    case 0xf:
      sVar1 = (other->field_0).common_.tag_;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = (this->field_0).int64_.val_;
      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
      (other->field_0).int64_.val_ = iVar7;
      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
      (this->field_0).common_.tag_ = sVar1;
      (this->field_0).int64_.val_ = iVar5;
    }
    return;
  case 0xc:
  case 0xd:
  case 0xe:
    sVar1 = (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar7;
    *(byte *)&this->field_0 = bVar8 & 0xf;
    (this->field_0).common_.tag_ = sVar1;
    (this->field_0).int64_.val_ = iVar5;
    break;
  case 0xf:
    sVar1 = (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar7;
    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
    (this->field_0).common_.tag_ = sVar1;
    (this->field_0).int64_.val_ = iVar5;
  }
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }